

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeThumbTableBranch(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  DecodeStatus DVar4;
  uint64_t in_RCX;
  MCInst *in_RDX;
  uint32_t in_ESI;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffc8;
  uint RegNo;
  undefined4 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0x10,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0,4);
  if (uVar2 == 0xc) {
    local_4 = MCDisassembler_SoftFail;
  }
  DVar4 = DecodeGPRRegisterClass
                    ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                     (uint)((ulong)in_RDX >> 0x20),in_RCX,(void *)CONCAT44(local_4,uVar2));
  RegNo = (uint)(in_RCX >> 0x20);
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
  if (_Var1) {
    DVar4 = DecoderGPRRegisterClass
                      (in_RDX,RegNo,CONCAT44(local_4,uVar2),
                       (void *)CONCAT44(uVar3,in_stack_ffffffffffffffc8));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
    if (!_Var1) {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeThumbTableBranch(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);

	if (Rn == ARM_SP) S = MCDisassembler_SoftFail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}